

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O0

void jinit_d_main_controller(j_decompress_ptr cinfo,boolean need_full_buffer)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int in_ESI;
  long *in_RDI;
  jpeg_component_info *compptr;
  int ngroups;
  int rgroup;
  int ci;
  my_main_ptr_conflict main_ptr;
  long local_30;
  int local_24;
  int local_1c;
  undefined4 in_stack_fffffffffffffff0;
  
  puVar1 = (undefined8 *)(**(code **)in_RDI[1])(in_RDI,1,0x88);
  in_RDI[0x45] = (long)puVar1;
  *puVar1 = start_pass_main;
  if (in_ESI != 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 4;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (*(int *)(in_RDI[0x4c] + 0x10) == 0) {
    local_24 = (int)in_RDI[0x34];
  }
  else {
    if ((int)in_RDI[0x34] < 2) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x2f;
      (**(code **)*in_RDI)(in_RDI);
    }
    alloc_funny_pointers((j_decompress_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    local_24 = (int)in_RDI[0x34] + 2;
  }
  local_1c = 0;
  local_30 = in_RDI[0x26];
  for (; local_1c < (int)in_RDI[7]; local_1c = local_1c + 1) {
    uVar2 = (**(code **)(in_RDI[1] + 0x10))
                      (in_RDI,1,*(int *)(local_30 + 0x1c) * *(int *)(local_30 + 0x24),
                       ((*(int *)(local_30 + 0xc) * *(int *)(local_30 + 0x24)) / (int)in_RDI[0x34])
                       * local_24);
    puVar1[(long)local_1c + 2] = uVar2;
    local_30 = local_30 + 0x60;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_d_main_controller(j_decompress_ptr cinfo, boolean need_full_buffer)
{
  my_main_ptr main_ptr;
  int ci, rgroup, ngroups;
  jpeg_component_info *compptr;

  main_ptr = (my_main_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_main_controller));
  cinfo->main = (struct jpeg_d_main_controller *)main_ptr;
  main_ptr->pub.start_pass = start_pass_main;

  if (need_full_buffer)         /* shouldn't happen */
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);

  /* Allocate the workspace.
   * ngroups is the number of row groups we need.
   */
  if (cinfo->upsample->need_context_rows) {
    if (cinfo->_min_DCT_scaled_size < 2) /* unsupported, see comments above */
      ERREXIT(cinfo, JERR_NOTIMPL);
    alloc_funny_pointers(cinfo); /* Alloc space for xbuffer[] lists */
    ngroups = cinfo->_min_DCT_scaled_size + 2;
  } else {
    ngroups = cinfo->_min_DCT_scaled_size;
  }

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    rgroup = (compptr->v_samp_factor * compptr->_DCT_scaled_size) /
      cinfo->_min_DCT_scaled_size; /* height of a row group of component */
    main_ptr->buffer[ci] = (*cinfo->mem->alloc_sarray)
                        ((j_common_ptr)cinfo, JPOOL_IMAGE,
                         compptr->width_in_blocks * compptr->_DCT_scaled_size,
                         (JDIMENSION)(rgroup * ngroups));
  }
}